

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.hpp
# Opt level: O2

int __thiscall libtorrent::piece_picker::piece_pos::priority(piece_pos *this,piece_picker *picker)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  
  uVar1 = *(uint *)this;
  iVar3 = -1;
  if ((((0x1fffffff < uVar1) && ((this->index).m_val != -1)) &&
      (picker->m_seeds + (uVar1 & 0x3ffffff) != 0)) &&
     (bVar2 = (byte)(uVar1 >> 0x1a) & 7, 1 < (byte)(bVar2 - 1))) {
    iVar3 = -1;
    if (1 < (byte)(bVar2 - 5)) {
      iVar3 = (bVar2 == 4) - 3;
    }
    iVar3 = (8 - (uVar1 >> 0x1d)) * ((uVar1 & 0x3ffffff) + 1) * 3 + iVar3;
  }
  return iVar3;
}

Assistant:

bool filtered() const { return piece_priority == filter_priority; }